

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBackwardCompatibility.cpp
# Opt level: O0

void anon_unknown.dwarf_2d24c::diffScanlineImages
               (string *planarScanlineName,string *interleavedScanlineName)

{
  char *in_stack_00000210;
  char *in_stack_000002e0;
  char *in_stack_00000b98;
  char *in_stack_00000ba0;
  
  std::__cxx11::string::c_str();
  generateScanlinePlanarImage(in_stack_000002e0);
  std::__cxx11::string::c_str();
  diffImageFiles(in_stack_00000ba0,in_stack_00000b98);
  std::__cxx11::string::c_str();
  generateScanlineInterleavedImage(in_stack_00000210);
  std::__cxx11::string::c_str();
  diffImageFiles(in_stack_00000ba0,in_stack_00000b98);
  return;
}

Assistant:

void
diffScanlineImages (
    const std::string& planarScanlineName,
    const std::string& interleavedScanlineName)
{
    // Planar Images
    generateScanlinePlanarImage (planarScanlineName.c_str ());
    diffImageFiles (
        planarScanlineName.c_str (),
        ILM_IMF_TEST_IMAGEDIR "v1.7.test.planar.exr");

    // Interleaved Images
    generateScanlineInterleavedImage (interleavedScanlineName.c_str ());
    diffImageFiles (
        interleavedScanlineName.c_str (),
        ILM_IMF_TEST_IMAGEDIR "v1.7.test.interleaved.exr");
}